

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask7_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 7 | *out;
  *out = in[2] << 0xe | *out;
  *out = in[3] << 0x15 | *out;
  *out = in[4] << 0x1c | *out;
  puVar1 = out + 1;
  *puVar1 = in[4] >> 4;
  *puVar1 = in[5] << 3 | *puVar1;
  *puVar1 = in[6] << 10 | *puVar1;
  *puVar1 = in[7] << 0x11 | *puVar1;
  *puVar1 = in[8] << 0x18 | *puVar1;
  *puVar1 = in[9] << 0x1f | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[9] >> 1;
  *puVar1 = in[10] << 6 | *puVar1;
  *puVar1 = in[0xb] << 0xd | *puVar1;
  *puVar1 = in[0xc] << 0x14 | *puVar1;
  *puVar1 = in[0xd] << 0x1b | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[0xd] >> 5;
  *puVar1 = in[0xe] << 2 | *puVar1;
  *puVar1 = in[0xf] << 9 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask7_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (7 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (7 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (7 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 9;
  ++in;

  return out + 1;
}